

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_lu.c
# Opt level: O1

_Bool test_lu_invmul_x(_Bool inplace,int n_row,int n_col,int N,int field)

{
  long lVar1;
  byte bVar2;
  int n_row_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *cp;
  byte *pbVar9;
  byte *pbVar10;
  undefined7 in_register_00000039;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  uint uVar14;
  ulong uVar15;
  _Bool _Var16;
  byte abStack_130 [8];
  byte abStack_128 [8];
  undefined1 local_120 [8];
  m256v X1;
  m256v X;
  m256v A;
  undefined1 local_78 [8];
  m256v Y;
  
  Y.e._0_4_ = (undefined4)CONCAT71(in_register_00000039,inplace);
  n_row_00 = n_col;
  if (n_col < n_row) {
    n_row_00 = n_row;
  }
  Y.e._4_4_ = N;
  bVar2 = get_mask(N);
  uVar14 = n_col * n_row;
  uVar15 = (ulong)(uint)(n_col * 4);
  _Var16 = false;
  uVar11 = uVar15 + 0xf & 0xfffffffffffffff0;
  uVar7 = (ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0;
  uVar6 = (ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0;
  uVar5 = 0;
  while( true ) {
    lVar1 = -((ulong)uVar14 + 0xf & 0xfffffffffffffff0);
    pbVar8 = abStack_128 + lVar1;
    if (0 < (int)uVar14) {
      uVar12 = 0;
      do {
        pbVar9 = abStack_130 + lVar1;
        pbVar9[0] = 0x69;
        pbVar9[1] = 0x21;
        pbVar9[2] = 0x10;
        pbVar9[3] = 0;
        pbVar9[4] = 0;
        pbVar9[5] = 0;
        pbVar9[6] = 0;
        pbVar9[7] = 0;
        iVar3 = rand();
        pbVar8[uVar12] = (byte)iVar3 & bVar2;
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
    pbVar10 = abStack_130 + lVar1;
    pbVar10[0] = 0x91;
    pbVar10[1] = 0x21;
    pbVar10[2] = 0x10;
    pbVar10[3] = 0;
    pbVar10[4] = 0;
    pbVar10[5] = 0;
    pbVar10[6] = 0;
    pbVar10[7] = 0;
    m256v_make((m256v *)&X.e,n_row,n_col,pbVar8);
    pbVar8 = pbVar8 + -uVar11;
    if (0 < n_col) {
      uVar12 = 0;
      do {
        pbVar8[-8] = 0xab;
        pbVar8[-7] = 0x21;
        pbVar8[-6] = 0x10;
        pbVar8[-5] = 0;
        pbVar8[-4] = 0;
        pbVar8[-3] = 0;
        pbVar8[-2] = 0;
        pbVar8[-1] = 0;
        iVar3 = rand();
        pbVar8[uVar12] = (byte)iVar3 & bVar2;
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
    }
    pbVar8[-8] = 0xd5;
    pbVar8[-7] = 0x21;
    pbVar8[-6] = 0x10;
    pbVar8[-5] = 0;
    pbVar8[-4] = 0;
    pbVar8[-3] = 0;
    pbVar8[-2] = 0;
    pbVar8[-1] = 0;
    m256v_make((m256v *)&X1.e,n_col,4,pbVar8);
    pbVar8 = pbVar8 + -((ulong)(uint)(n_row_00 * 4) + 0xf & 0xfffffffffffffff0);
    pbVar8[-8] = 0xf7;
    pbVar8[-7] = 0x21;
    pbVar8[-6] = 0x10;
    pbVar8[-5] = 0;
    pbVar8[-4] = 0;
    pbVar8[-3] = 0;
    pbVar8[-2] = 0;
    pbVar8[-1] = 0;
    m256v_make((m256v *)local_78,n_row_00,4,pbVar8);
    local_78._0_4_ = n_row;
    pbVar8[-8] = 0x12;
    pbVar8[-7] = 0x22;
    pbVar8[-6] = 0x10;
    pbVar8[-5] = 0;
    pbVar8[-4] = 0;
    pbVar8[-3] = 0;
    pbVar8[-2] = 0;
    pbVar8[-1] = 0;
    m256v_mul((m256v *)&X.e,(m256v *)&X1.e,(m256v *)local_78);
    pbVar8 = pbVar8 + -uVar7;
    cp = pbVar8 + -uVar6;
    cp[-8] = 0x34;
    cp[-7] = 0x22;
    cp[-6] = 0x10;
    cp[-5] = 0;
    cp[-4] = 0;
    cp[-3] = 0;
    cp[-2] = 0;
    cp[-1] = 0;
    iVar3 = m256v_LU_decomp_inplace((m256v *)&X.e,(int *)pbVar8,(int *)cp);
    if ((char)Y.e == '\0') {
      pbVar13 = cp + -uVar11;
      if (0 < n_col) {
        uVar12 = 0;
        do {
          pbVar13[-8] = 0xb5;
          pbVar13[-7] = 0x22;
          pbVar13[-6] = 0x10;
          pbVar13[-5] = 0;
          pbVar13[-4] = 0;
          pbVar13[-3] = 0;
          pbVar13[-2] = 0;
          pbVar13[-1] = 0;
          iVar4 = rand();
          pbVar13[uVar12] = (byte)iVar4 & bVar2;
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
      pbVar13[-8] = 0xe2;
      pbVar13[-7] = 0x22;
      pbVar13[-6] = 0x10;
      pbVar13[-5] = 0;
      pbVar13[-4] = 0;
      pbVar13[-3] = 0;
      pbVar13[-2] = 0;
      pbVar13[-1] = 0;
      m256v_make((m256v *)local_120,n_col,4,pbVar13);
      pbVar13[-8] = 9;
      pbVar13[-7] = 0x23;
      pbVar13[-6] = 0x10;
      pbVar13[-5] = 0;
      pbVar13[-4] = 0;
      pbVar13[-3] = 0;
      pbVar13[-2] = 0;
      pbVar13[-1] = 0;
      m256v_LU_invmult((m256v *)&X.e,iVar3,(int *)pbVar8,(int *)cp,(m256v *)local_78,
                       (m256v *)local_120);
      local_78._0_4_ = n_col;
      if (0 < n_col) {
        iVar4 = 0;
        do {
          pbVar13[-8] = 0x24;
          pbVar13[-7] = 0x23;
          pbVar13[-6] = 0x10;
          pbVar13[-5] = 0;
          pbVar13[-4] = 0;
          pbVar13[-3] = 0;
          pbVar13[-2] = 0;
          pbVar13[-1] = 0;
          m256v_copy_row((m256v *)local_120,iVar4,(m256v *)local_78,iVar4);
          iVar4 = iVar4 + 1;
        } while (n_col != iVar4);
      }
    }
    else {
      pbVar13 = cp + -uVar6;
      pbVar13[-8] = 0x67;
      pbVar13[-7] = 0x22;
      pbVar13[-6] = 0x10;
      pbVar13[-5] = 0;
      pbVar13[-4] = 0;
      pbVar13[-3] = 0;
      pbVar13[-2] = 0;
      pbVar13[-1] = 0;
      perm_invert(n_col,(int *)cp,(int *)pbVar13);
      local_78._0_4_ = n_row_00;
      pbVar13[-8] = 0x8c;
      pbVar13[-7] = 0x22;
      pbVar13[-6] = 0x10;
      pbVar13[-5] = 0;
      pbVar13[-4] = 0;
      pbVar13[-3] = 0;
      pbVar13[-2] = 0;
      pbVar13[-1] = 0;
      m256v_LU_invmult_inplace((m256v *)&X.e,iVar3,(int *)pbVar8,(int *)pbVar13,(m256v *)local_78);
      local_78._0_4_ = n_col;
    }
    cp[-8] = 0x4a;
    cp[-7] = 0x23;
    cp[-6] = 0x10;
    cp[-5] = 0;
    cp[-4] = 0;
    cp[-3] = 0;
    cp[-2] = 0;
    cp[-1] = 0;
    m256v_add_inplace((m256v *)&X1.e,(m256v *)local_78);
    if (iVar3 < n_col) {
      pbVar13 = cp + -uVar7;
      pbVar13[-8] = 0x71;
      pbVar13[-7] = 0x23;
      pbVar13[-6] = 0x10;
      pbVar13[-5] = 0;
      pbVar13[-4] = 0;
      pbVar13[-3] = 0;
      pbVar13[-2] = 0;
      pbVar13[-1] = 0;
      perm_invert(n_row,(int *)pbVar8,(int *)pbVar13);
      pbVar13[-8] = 0x95;
      pbVar13[-7] = 0x23;
      pbVar13[-6] = 0x10;
      pbVar13[-5] = 0;
      pbVar13[-4] = 0;
      pbVar13[-3] = 0;
      pbVar13[-2] = 0;
      pbVar13[-1] = 0;
      local_78._0_4_ = n_row_00;
      m256v_LU_mult_inplace((m256v *)&X.e,(int *)pbVar13,(int *)cp,(m256v *)local_78);
      local_78._0_4_ = n_row;
    }
    cp[-8] = 0xa4;
    cp[-7] = 0x23;
    cp[-6] = 0x10;
    cp[-5] = 0;
    cp[-4] = 0;
    cp[-3] = 0;
    cp[-2] = 0;
    cp[-1] = 0;
    iVar3 = m256v_iszero((m256v *)local_78);
    if (iVar3 == 0) break;
    _Var16 = 0x270e < uVar5;
    uVar5 = uVar5 + 1;
    if (uVar5 == 10000) {
      return _Var16;
    }
  }
  cp[-8] = 6;
  cp[-7] = 0x24;
  cp[-6] = 0x10;
  cp[-5] = 0;
  cp[-4] = 0;
  cp[-3] = 0;
  cp[-2] = 0;
  cp[-1] = 0;
  fprintf(_stderr,"Error:  LU inversion gave wrong result. (field=%d, it=%d)\n",(ulong)Y.e._4_4_);
  return _Var16;
}

Assistant:

static bool test_lu_invmul_x(bool inplace, int n_row, int n_col, int N, int field)
{
	const int maxdim = (n_row > n_col ? n_row : n_col);
	const int data_width = 4;
	const uint8_t mask = get_mask(field);

	int ntest = 0;
	for (int i = 0; i < N; ++i) {
		/* Create a random matrix & testing data */
		Def_mat256_rand(A, a, n_row, n_col, mask)
		Def_mat256_rand(X, x, n_col, data_width, mask)

		/* Compute Y := A*X the direct way */
		m256v_Def(Y, y, maxdim, data_width)
		Y.n_row = n_row;
		m256v_mul(&A, &X, &Y);

		/* Calculate LU decomposition */
		int rp[n_row], cp[n_col];
		const int rank = m256v_LU_decomp_inplace(&A, rp, cp);
		++ntest;

		/* Reconstruct X from LU and Y.
		 *
		 * This is not completely possible if the rank of the
		 * matrix is not full.  In such cases, we check if the
		 * difference of X with its reconstructed version is in
		 * the kernel of A.
		 */
		if (inplace) {
			int inv_cp[n_col];
			perm_invert(n_col, cp, inv_cp);

			Y.n_row = maxdim;
			m256v_LU_invmult_inplace(&A, rank, rp, inv_cp, &Y);
			Y.n_row = n_col;
		} else {
			Def_mat256_rand(X1, x1, n_col, data_width, mask)
			m256v_LU_invmult(&A, rank, rp, cp, &Y, &X1);

			/* Copy result back into Y */
			Y.n_row = n_col;
			for (int i = 0; i < n_col; ++i)
				m256v_copy_row(&X1, i, &Y, i);
		}

		/* Check the result */
		m256v_add_inplace(&X, &Y);
		if (rank < n_col) {
			/* If the matrix is not full rank, the resulting
			 * difference is not necessarily zero, but it
			 * must be in the kernel of A.
			 */
			int inv_rp[n_row];
			perm_invert(n_row, rp, inv_rp);
			Y.n_row = maxdim;
			m256v_LU_mult_inplace(&A, inv_rp, cp, &Y);
			Y.n_row = n_row;
		}
		if (!m256v_iszero(&Y)) {
			fprintf(stderr, "Error:  LU inversion gave "
			  "wrong result. (field=%d, it=%d)\n", field, i);
			return false;
		}
	}

	return true;
}